

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toCurrencyString(QLocale *this,qlonglong value,QString *symbol)

{
  QStringView v;
  QAnyStringView s;
  QAnyStringView s_00;
  QAnyStringView pattern;
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  long in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar4;
  QString *res;
  QString sym;
  QString str;
  DataRange range;
  CurrencyToStringArgument arg;
  ArgBase *argBases [3];
  QVariant *in_stack_fffffffffffffd58;
  CurrencyToStringArgument *in_stack_fffffffffffffd60;
  CurrencyToStringArgument *in_stack_fffffffffffffd68;
  QString *str_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffd70;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  DataRange *in_stack_fffffffffffffd78;
  qlonglong in_stack_fffffffffffffd80;
  undefined1 *puVar6;
  CurrencySymbolFormat format;
  QString *this_00;
  ArgBase **args;
  undefined1 **numArgs;
  ArgBase *local_1a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar7;
  undefined1 *local_188;
  undefined1 *puStack_180;
  undefined1 *local_178;
  DataRange local_168;
  DataRange local_160;
  undefined1 local_148 [40];
  QString local_120;
  QStringView local_108;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [64];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QString *local_28;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d9d2b);
  if (pQVar2->m_data == &systemLocaleData) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant(&in_stack_fffffffffffffd60->value,(qlonglong)in_stack_fffffffffffffd68);
    QSystemLocale::CurrencyToStringArgument::CurrencyToStringArgument
              ((CurrencyToStringArgument *)in_stack_fffffffffffffd70.m_data,
               &in_stack_fffffffffffffd68->value,(QString *)in_stack_fffffffffffffd60);
    ::QVariant::~QVariant(&in_stack_fffffffffffffd60->value);
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    ::QVariant::fromValue<QSystemLocale::CurrencyToStringArgument>(in_stack_fffffffffffffd68);
    (*pQVar3->_vptr_QSystemLocale[2])(local_a8,pQVar3,0x20,local_c8);
    ::QVariant::toString(in_stack_fffffffffffffd58);
    ::QVariant::~QVariant(&in_stack_fffffffffffffd60->value);
    ::QVariant::~QVariant(&in_stack_fffffffffffffd60->value);
    bVar1 = QString::isEmpty((QString *)0x4d9e51);
    if (bVar1) {
      QString::~QString((QString *)0x4d9efe);
    }
    QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(in_stack_fffffffffffffd60);
    if (!bVar1) goto LAB_004da2ef;
  }
  format = (CurrencySymbolFormat)((ulong)in_RDI >> 0x20);
  local_160 = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d9f47);
  local_160 = QLocaleData::currencyFormatNegative(pQVar2->m_data);
  if ((local_160.size == 0) || (-1 < in_RDX)) {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4d9f76);
    local_168 = QLocaleData::currencyFormat(pQVar2->m_data);
    local_160 = local_168;
  }
  local_188 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
  puVar6 = &DAT_aaaaaaaaaaaaaaaa;
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  toString((QLocale *)&DAT_aaaaaaaaaaaaaaaa,in_stack_fffffffffffffd80);
  local_1a8 = (ArgBase *)&DAT_aaaaaaaaaaaaaaaa;
  aVar7.m_data = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QString::isNull((QString *)0x4da013);
  if (bVar1) {
    currencySymbol((QLocale *)this_00,format);
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffd60,(QString *)in_stack_fffffffffffffd58);
  }
  bVar1 = QString::isEmpty((QString *)0x4da060);
  if (bVar1) {
    currencySymbol((QLocale *)this_00,format);
    QString::operator=((QString *)in_stack_fffffffffffffd60,(QString *)in_stack_fffffffffffffd58);
    QString::~QString((QString *)0x4da09e);
  }
  QVar4 = QLocaleData::DataRange::viewData
                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70.m_data_utf16);
  numArgs = &local_188;
  args = &local_1a8;
  v.m_data = QVar4.m_data;
  v.m_size = (qsizetype)in_stack_fffffffffffffd70.m_data;
  local_108 = QVar4;
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffd68,v);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffd70.m_data,(QString *)in_stack_fffffffffffffd68
            );
  str_00 = &local_120;
  s.m_size = (size_t)QVar4.m_data;
  s.field_0.m_data = in_stack_fffffffffffffd70.m_data;
  QtPrivate::qStringLikeToArg(s);
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffd70.m_data,str_00);
  aVar5.m_data = local_148;
  s_00.m_size = (size_t)QVar4.m_data;
  s_00.field_0.m_data = aVar5.m_data;
  QtPrivate::qStringLikeToArg(s_00);
  local_d8 = local_f8;
  uStack_d0 = local_f0;
  local_18 = 0;
  local_e8 = local_f8;
  uStack_e0 = local_f0;
  pattern.m_size = (size_t)puVar6;
  pattern.field_0.m_data = aVar7.m_data;
  local_28 = str_00;
  aStack_20 = aVar5;
  QtPrivate::argToQString(pattern,(size_t)numArgs,args);
  QString::~QString((QString *)0x4da2d1);
  QString::~QString((QString *)0x4da2de);
LAB_004da2ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toCurrencyString(qlonglong value, const QString &symbol) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QLocaleData::DataRange range = d->m_data->currencyFormatNegative();
    if (!range.size || value >= 0)
        range = d->m_data->currencyFormat();
    else
        value = -value;
    QString str = toString(value);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return range.viewData(currency_format_data).arg(str, sym);
}